

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall
string_view_assignment_operator_Test::TestBody(string_view_assignment_operator_Test *this)

{
  size_type in_RCX;
  string_view sv;
  string_view sv_00;
  string_view local_60;
  undefined1 local_50 [8];
  string_view sv2;
  string_view local_30;
  undefined1 local_20 [8];
  string_view sv1;
  string_view_assignment_operator_Test *this_local;
  
  sv1.size_ = (size_type)this;
  wabt::string_view::string_view((string_view *)local_20);
  wabt::string_view::string_view(&local_30,"assign");
  local_20 = (undefined1  [8])local_30.data_;
  sv1.data_ = (char *)local_30.size_;
  sv2.size_ = (size_type)local_30.data_;
  sv.size_ = in_RCX;
  sv.data_ = (char *)local_30.size_;
  anon_unknown.dwarf_7ad84::assert_string_view_eq
            ((anon_unknown_dwarf_7ad84 *)"assign",local_30.data_,sv);
  wabt::string_view::string_view((string_view *)local_50);
  wabt::string_view::string_view(&local_60);
  local_50 = (undefined1  [8])local_60.data_;
  sv2.data_ = (char *)local_60.size_;
  sv_00.size_ = in_RCX;
  sv_00.data_ = (char *)local_60.size_;
  anon_unknown.dwarf_7ad84::assert_string_view_eq
            ((anon_unknown_dwarf_7ad84 *)0x4f1280,local_60.data_,sv_00);
  return;
}

Assistant:

TEST(string_view, assignment_operator) {
  string_view sv1;
  sv1 = string_view("assign");
  assert_string_view_eq("assign", sv1);

  string_view sv2;
  sv2 = string_view();
  assert_string_view_eq("", sv2);
}